

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O3

bool ViewImage(string *path,Range range)

{
  int cyl_step;
  bool bVar1;
  int def_cyls;
  int def_heads;
  LogHelper *pLVar2;
  shared_ptr<Disk> disk;
  shared_ptr<Disk> local_58;
  Range local_48;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_48._8_8_ = range._8_8_;
  local_48._0_8_ = range._0_8_;
  pLVar2 = util::operator<<((LogHelper *)&util::cout,(char (*) [2])0x1b0fac);
  pLVar2 = util::operator<<(pLVar2,path);
  util::operator<<(pLVar2,(char (*) [3])"]\n");
  local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Disk *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Disk,std::allocator<Disk>>
            (&local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Disk **)&local_58,(allocator<Disk> *)&local_38);
  bVar1 = ReadImage(path,&local_58,true);
  cyl_step = opt.step;
  if (bVar1) {
    def_cyls = Disk::cyls(local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    def_heads = Disk::heads(local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ValidateRange(&local_48,0x80,2,cyl_step,def_cyls,def_heads);
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_view.cpp:211:20)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_view.cpp:211:20)>
               ::_M_manager;
    local_38._M_unused._M_object = &local_58;
    Range::each(&local_48,(function<void_(const_CylHead_&)> *)&local_38,true);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  if (local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool ViewImage(const std::string& path, Range range)
{
    util::cout << "[" << path << "]\n";

    auto disk = std::make_shared<Disk>();
    if (ReadImage(path, disk))
    {
        ValidateRange(range, MAX_TRACKS, MAX_SIDES, opt.step, disk->cyls(), disk->heads());

        range.each([&](const CylHead& cylhead) {
            auto track = disk->read_track(cylhead * opt.step);
            NormaliseTrack(cylhead, track);
            ViewTrack(cylhead, track);

            if (opt.verbose)
            {
                auto trackdata = disk->read(cylhead * opt.step);
                auto bitbuf = trackdata.preferred().bitstream();
                NormaliseBitstream(bitbuf);
                auto encoding = (opt.encoding == Encoding::Unknown) ?
                    bitbuf.encoding : opt.encoding;

                switch (encoding)
                {
                case Encoding::MFM:
                case Encoding::Amiga:
                case Encoding::Agat:
                case Encoding::MX:
                    ViewTrack_MFM_FM(Encoding::MFM, bitbuf);
                    break;
                case Encoding::FM:
                case Encoding::RX02:
                    ViewTrack_MFM_FM(Encoding::FM, bitbuf);
                    break;
                default:
                    throw util::exception("unsupported track view encoding");
                }
            }
            }, true);
    }

    return true;
}